

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void encode_scalar(upb_encstate *e,void *_field_mem,upb_MiniTableSubInternal *subs,
                  upb_MiniTableField *f)

{
  int *piVar1;
  byte bVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  upb_MiniTable *puVar7;
  uint uVar8;
  ulong uVar9;
  size_t size;
  ulong local_30;
  
  switch(f->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
    uVar4 = *_field_mem;
    if ((ulong)((long)e->ptr - (long)e->buf) < 8) {
      encode_growbuffer(e,8);
    }
    else {
      e->ptr = e->ptr + -8;
    }
    *(undefined8 *)e->ptr = uVar4;
    goto LAB_00121f54;
  case '\x02':
    uVar3 = *_field_mem;
    if ((ulong)((long)e->ptr - (long)e->buf) < 4) {
      encode_growbuffer(e,4);
    }
    else {
      e->ptr = e->ptr + -4;
    }
    *(undefined4 *)e->ptr = uVar3;
    goto LAB_00121f71;
  case '\x03':
  case '\x04':
    uVar9 = *_field_mem;
    break;
  case '\x05':
  case '\x0e':
    uVar9 = (ulong)*_field_mem;
    break;
  case '\x06':
  case '\x10':
    uVar4 = *_field_mem;
    if ((ulong)((long)e->ptr - (long)e->buf) < 8) {
      encode_growbuffer(e,8);
    }
    else {
      e->ptr = e->ptr + -8;
    }
    *(undefined8 *)e->ptr = uVar4;
LAB_00121f54:
    iVar6 = 1;
    goto LAB_00121fd3;
  case '\a':
  case '\x0f':
    uVar3 = *_field_mem;
    if ((ulong)((long)e->ptr - (long)e->buf) < 4) {
      encode_growbuffer(e,4);
    }
    else {
      e->ptr = e->ptr + -4;
    }
    *(undefined4 *)e->ptr = uVar3;
LAB_00121f71:
    iVar6 = 5;
    goto LAB_00121fd3;
  case '\b':
    bVar2 = *_field_mem;
    pcVar5 = e->ptr;
    if (pcVar5 == e->buf) {
      uVar9 = (ulong)bVar2;
      goto LAB_00121fc9;
    }
    e->ptr = pcVar5 + -1;
    pcVar5[-1] = bVar2;
    goto LAB_00121fd1;
  case '\t':
  case '\f':
    uVar9 = *(ulong *)((long)_field_mem + 8);
    encode_bytes(e,*_field_mem,uVar9);
    if ((uVar9 < 0x80) && (pcVar5 = e->ptr, pcVar5 != e->buf)) {
      e->ptr = pcVar5 + -1;
      pcVar5[-1] = (char)uVar9;
    }
    else {
      encode_longvarint(e,uVar9);
    }
    goto LAB_00121f86;
  case '\n':
    uVar9 = *_field_mem;
    if (uVar9 == 0) {
      return;
    }
    puVar7 = *subs[f->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_00122023:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    uVar8 = f->number_dont_copy_me__upb_internal_use_only * 8 + 4;
    if ((f->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
       (pcVar5 = e->ptr, pcVar5 != e->buf)) {
      e->ptr = pcVar5 + -1;
      pcVar5[-1] = (char)uVar8;
    }
    else {
      encode_longvarint(e,(ulong)uVar8);
    }
    if ((uVar9 & 1) != 0) {
      puVar7 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
    }
    encode_message(e,(upb_Message *)(uVar9 & 0xfffffffffffffffe),puVar7,&local_30);
    e->depth = e->depth + 1;
    iVar6 = 3;
    goto LAB_00121fd3;
  case '\v':
    uVar9 = *_field_mem;
    if (uVar9 == 0) {
      return;
    }
    puVar7 = *subs[f->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_00122023;
    if ((uVar9 & 1) != 0) {
      puVar7 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
    }
    encode_message(e,(upb_Message *)(uVar9 & 0xfffffffffffffffe),puVar7,&local_30);
    if ((local_30 < 0x80) && (pcVar5 = e->ptr, pcVar5 != e->buf)) {
      e->ptr = pcVar5 + -1;
      pcVar5[-1] = (char)local_30;
    }
    else {
      encode_longvarint(e,local_30);
    }
    e->depth = e->depth + 1;
LAB_00121f86:
    iVar6 = 2;
    goto LAB_00121fd3;
  case '\r':
    uVar9 = (ulong)*_field_mem;
    break;
  case '\x11':
    uVar8 = *_field_mem >> 0x1f ^ *_field_mem * 2;
    uVar9 = (ulong)uVar8;
    if (0x7f < uVar8) goto LAB_00121fc9;
    goto LAB_00121e8b;
  case '\x12':
    uVar9 = *_field_mem >> 0x3f ^ *_field_mem * 2;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/wire/encode.c"
                  ,0x135,
                  "void encode_scalar(upb_encstate *, const void *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  if (uVar9 < 0x80) {
LAB_00121e8b:
    pcVar5 = e->ptr;
    if (pcVar5 == e->buf) goto LAB_00121fc9;
    e->ptr = pcVar5 + -1;
    pcVar5[-1] = (char)uVar9;
  }
  else {
LAB_00121fc9:
    encode_longvarint(e,uVar9);
  }
LAB_00121fd1:
  iVar6 = 0;
LAB_00121fd3:
  uVar8 = iVar6 + f->number_dont_copy_me__upb_internal_use_only * 8;
  if ((f->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
     (pcVar5 = e->ptr, pcVar5 != e->buf)) {
    e->ptr = pcVar5 + -1;
    pcVar5[-1] = (char)uVar8;
    return;
  }
  encode_longvarint(e,(ulong)uVar8);
  return;
}

Assistant:

static void encode_scalar(upb_encstate* e, const void* _field_mem,
                          const upb_MiniTableSubInternal* subs,
                          const upb_MiniTableField* f) {
  const char* field_mem = _field_mem;
  int wire_type;

#define CASE(ctype, type, wtype, encodeval) \
  {                                         \
    ctype val = *(ctype*)field_mem;         \
    encode_##type(e, encodeval);            \
    wire_type = wtype;                      \
    break;                                  \
  }

  switch (f->UPB_PRIVATE(descriptortype)) {
    case kUpb_FieldType_Double:
      CASE(double, double, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Float:
      CASE(float, float, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Int64:
    case kUpb_FieldType_UInt64:
      CASE(uint64_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_UInt32:
      CASE(uint32_t, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_Int32:
    case kUpb_FieldType_Enum:
      CASE(int32_t, varint, kUpb_WireType_Varint, (int64_t)val);
    case kUpb_FieldType_SFixed64:
    case kUpb_FieldType_Fixed64:
      CASE(uint64_t, fixed64, kUpb_WireType_64Bit, val);
    case kUpb_FieldType_Fixed32:
    case kUpb_FieldType_SFixed32:
      CASE(uint32_t, fixed32, kUpb_WireType_32Bit, val);
    case kUpb_FieldType_Bool:
      CASE(bool, varint, kUpb_WireType_Varint, val);
    case kUpb_FieldType_SInt32:
      CASE(int32_t, varint, kUpb_WireType_Varint, encode_zz32(val));
    case kUpb_FieldType_SInt64:
      CASE(int64_t, varint, kUpb_WireType_Varint, encode_zz64(val));
    case kUpb_FieldType_String:
    case kUpb_FieldType_Bytes: {
      upb_StringView view = *(upb_StringView*)field_mem;
      encode_bytes(e, view.data, view.size);
      encode_varint(e, view.size);
      wire_type = kUpb_WireType_Delimited;
      break;
    }
    case kUpb_FieldType_Group: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_tag(e, upb_MiniTableField_Number(f), kUpb_WireType_EndGroup);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      wire_type = kUpb_WireType_StartGroup;
      e->depth++;
      break;
    }
    case kUpb_FieldType_Message: {
      size_t size;
      upb_TaggedMessagePtr submsg = *(upb_TaggedMessagePtr*)field_mem;
      const upb_MiniTable* subm = _upb_Encoder_GetSubMiniTable(subs, f);
      if (submsg == 0) {
        return;
      }
      if (--e->depth == 0) encode_err(e, kUpb_EncodeStatus_MaxDepthExceeded);
      encode_TaggedMessagePtr(e, submsg, subm, &size);
      encode_varint(e, size);
      wire_type = kUpb_WireType_Delimited;
      e->depth++;
      break;
    }
    default:
      UPB_UNREACHABLE();
  }
#undef CASE

  encode_tag(e, upb_MiniTableField_Number(f), wire_type);
}